

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O2

error_t ArgumentHandlers::mmdp_method_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  bool bVar2;
  ostream *poVar3;
  undefined4 uVar4;
  error_t eVar5;
  allocator<char> local_31;
  string argString;
  
  pvVar1 = state->input;
  if (arg == (char *)0x0) {
    arg = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&argString,arg,&local_31);
  if (key == 0x74) {
    bVar2 = std::operator==(&argString,"ValueIteration");
    uVar4 = 0;
    eVar5 = 0;
    if (!bVar2) {
      bVar2 = std::operator==(&argString,"PolicyIteration");
      if (bVar2) {
        uVar4 = 1;
      }
      else {
        bVar2 = std::operator==(&argString,"PolicyIterationGPU");
        if (!bVar2) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"unkown mmdp_method \'");
          poVar3 = std::operator<<(poVar3,(string *)&argString);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
          abort();
        }
        uVar4 = 2;
      }
    }
    *(undefined4 *)((long)pvVar1 + 0x234) = uVar4;
  }
  else {
    eVar5 = 7;
  }
  std::__cxx11::string::~string((string *)&argString);
  return eVar5;
}

Assistant:

error_t
mmdp_method_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;
    std::string argString(arg ? arg : "");
    switch (key)
    {
        case 't': 
            if (argString=="ValueIteration")
                theArgumentsStruc->mmdp_method=ValueIteration;
            else if (argString=="PolicyIteration")
                theArgumentsStruc->mmdp_method=PolicyIteration;
            else if (argString=="PolicyIterationGPU")
                theArgumentsStruc->mmdp_method=PolicyIterationGPU;
            else
            {
                std::cerr<<"unkown mmdp_method '"<<argString<<"'"<<std::endl;
                abort();
            }
            break;
        default:
            return ARGP_ERR_UNKNOWN;
            break;
    }
    return 0;
}